

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.h
# Opt level: O2

void __thiscall despot::History::~History(History *this)

{
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->observations_).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)this);
  return;
}

Assistant:

void Add(ACT_TYPE action, OBS_TYPE obs) {
		actions_.push_back(action);
		observations_.push_back(obs);
	}